

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmSequence(LlvmCompilationContext *ctx,ExprSequence *node)

{
  LLVMValueRef pLVar1;
  ulong uVar2;
  
  if ((node->expressions).count == 0) {
    pLVar1 = (LLVMValueRef)0x0;
  }
  else {
    uVar2 = 0;
    do {
      pLVar1 = CompileLlvm(ctx,(node->expressions).data[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (node->expressions).count);
  }
  pLVar1 = CheckType(ctx,&node->super_ExprBase,pLVar1);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmSequence(LlvmCompilationContext &ctx, ExprSequence *node)
{
	LLVMValueRef result = NULL;

	for(unsigned i = 0; i < node->expressions.size(); i++)
		result = CompileLlvm(ctx, node->expressions[i]);

	return CheckType(ctx, node, result);
}